

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendCo(Gia_Man_t *p,int iLit0)

{
  Vec_Int_t *p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  bVar1 = false;
  if (-1 < iLit0) {
    iVar2 = Abc_Lit2Var(iLit0);
    iVar3 = Gia_ManObjNum(p);
    bVar1 = iVar2 < iVar3;
  }
  if (!bVar1) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  iVar2 = Abc_Lit2Var(iLit0);
  pGVar5 = Gia_ManObj(p,iVar2);
  iVar2 = Gia_ObjIsCo(pGVar5);
  if (iVar2 != 0) {
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  pGVar5 = Gia_ManAppendObj(p);
  *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffff7fffffff | 0x80000000;
  iVar2 = Gia_ObjId(p,pGVar5);
  iVar3 = Abc_Lit2Var(iLit0);
  *(ulong *)pGVar5 =
       *(ulong *)pGVar5 & 0xffffffffe0000000 | (ulong)(uint)(iVar2 - iVar3) & 0x1fffffff;
  uVar4 = Abc_LitIsCompl(iLit0);
  *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffdfffffff | ((ulong)uVar4 & 1) << 0x1d;
  uVar4 = Vec_IntSize(p->vCos);
  *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xe0000000ffffffff | ((ulong)uVar4 & 0x1fffffff) << 0x20;
  p_00 = p->vCos;
  iVar2 = Gia_ObjId(p,pGVar5);
  Vec_IntPush(p_00,iVar2);
  if (p->pFanData != (int *)0x0) {
    pObj_00 = Gia_ObjFanin0(pGVar5);
    Gia_ObjAddFanout(p,pObj_00,pGVar5);
  }
  iVar2 = Gia_ObjId(p,pGVar5);
  return iVar2 << 1;
}

Assistant:

static inline int Gia_ManAppendCo( Gia_Man_t * p, int iLit0 )  
{ 
    Gia_Obj_t * pObj;
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( !Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0))) );
    pObj = Gia_ManAppendObj( p );    
    pObj->fTerm = 1;
    pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
    pObj->fCompl0 = Abc_LitIsCompl(iLit0);
    pObj->iDiff1  = Vec_IntSize( p->vCos );
    Vec_IntPush( p->vCos, Gia_ObjId(p, pObj) );
    if ( p->pFanData )
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
    return Gia_ObjId( p, pObj ) << 1;
}